

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O3

REF_STATUS ref_interp_locate_subset(REF_INTERP ref_interp)

{
  REF_MPI ref_mpi;
  bool bVar1;
  uint uVar2;
  undefined8 uVar3;
  int iVar4;
  char *pcVar5;
  REF_BOOL increase_fuzz;
  REF_BOOL local_34;
  
  ref_mpi = ref_interp->ref_mpi;
  if ((ref_interp->instrument == 0) || (uVar2 = ref_mpi_stopwatch_start(ref_mpi), uVar2 == 0)) {
    uVar2 = ref_interp_seed_tree(ref_interp);
    if (uVar2 == 0) {
      if ((ref_interp->instrument == 0) ||
         (uVar2 = ref_mpi_stopwatch_stop(ref_mpi,"seed tree"), uVar2 == 0)) {
        uVar2 = ref_interp_process_agents(ref_interp);
        if (uVar2 == 0) {
          if ((ref_interp->instrument == 0) ||
             (uVar2 = ref_mpi_stopwatch_stop(ref_mpi,"drain"), uVar2 == 0)) {
            local_34 = 0;
            bVar1 = true;
            iVar4 = 0xc;
            while( true ) {
              if ((!bVar1) &&
                 (ref_interp->search_fuzz = ref_interp->search_fuzz * 10.0, ref_mpi->id == 0)) {
                printf("retry tree search with %e fuzz\n");
              }
              uVar2 = ref_interp_tree(ref_interp,&local_34);
              if (uVar2 != 0) break;
              if ((ref_interp->instrument != 0) &&
                 (uVar2 = ref_mpi_stopwatch_stop(ref_mpi,"tree"), uVar2 != 0)) {
                pcVar5 = "locate clock";
                uVar3 = 0x716;
                goto LAB_00160a32;
              }
              if ((long)local_34 == 0) {
                return 0;
              }
              bVar1 = false;
              iVar4 = iVar4 + -1;
              if (iVar4 == 0) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                       ,0x719,"ref_interp_locate_subset",
                       "unable to grow fuzz to find tree candidate",0,(long)local_34);
                return 1;
              }
            }
            pcVar5 = "tree";
            uVar3 = 0x714;
          }
          else {
            pcVar5 = "locate clock";
            uVar3 = 0x70a;
          }
        }
        else {
          pcVar5 = "drain";
          uVar3 = 0x708;
        }
      }
      else {
        pcVar5 = "locate clock";
        uVar3 = 0x706;
      }
    }
    else {
      pcVar5 = "seed tree nodes";
      uVar3 = 0x704;
    }
  }
  else {
    pcVar5 = "locate clock";
    uVar3 = 0x702;
  }
LAB_00160a32:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar3,
         "ref_interp_locate_subset",(ulong)uVar2,pcVar5);
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_interp_locate_subset(REF_INTERP ref_interp) {
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_BOOL increase_fuzz;
  REF_INT tries;

  if (ref_interp->instrument)
    RSS(ref_mpi_stopwatch_start(ref_mpi), "locate clock");

  RSS(ref_interp_seed_tree(ref_interp), "seed tree nodes");
  if (ref_interp->instrument)
    RSS(ref_mpi_stopwatch_stop(ref_mpi, "seed tree"), "locate clock");

  RSS(ref_interp_process_agents(ref_interp), "drain");
  if (ref_interp->instrument)
    RSS(ref_mpi_stopwatch_stop(ref_mpi, "drain"), "locate clock");

  increase_fuzz = REF_FALSE;
  for (tries = 0; tries < 12; tries++) {
    if (increase_fuzz) {
      ref_interp_search_fuzz(ref_interp) *= 10.0;
      if (ref_mpi_once(ref_mpi))
        printf("retry tree search with %e fuzz\n",
               ref_interp_search_fuzz(ref_interp));
    }
    RSS(ref_interp_tree(ref_interp, &increase_fuzz), "tree");
    if (ref_interp->instrument)
      RSS(ref_mpi_stopwatch_stop(ref_mpi, "tree"), "locate clock");
    if (!increase_fuzz) break;
  }
  REIS(REF_FALSE, increase_fuzz, "unable to grow fuzz to find tree candidate");

  return REF_SUCCESS;
}